

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printLabel(JSPrinter *this,Ref node)

{
  size_t sVar1;
  Ref *pRVar2;
  Ref local_18;
  Ref node_local;
  
  local_18.inst = node.inst;
  pRVar2 = Ref::operator[](&local_18,1);
  if (pRVar2->inst->type == String) {
    emit(this,(pRVar2->inst->field_1).str.str._M_str);
    space(this);
    maybeSpace(this,':');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = ':';
    space(this);
    pRVar2 = Ref::operator[](&local_18,2);
    print(this,pRVar2->inst);
    return;
  }
  __assert_fail("isString()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0xeb,"const char *cashew::Value::getCString()");
}

Assistant:

void printLabel(Ref node) {
    emit(node[1]->getCString());
    space();
    emit(':');
    space();
    print(node[2]);
  }